

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O3

ParquetColumnSchema *
duckdb::ColumnWriter::FillParquetSchema
          (ParquetColumnSchema *__return_storage_ptr__,
          vector<duckdb_parquet::SchemaElement,_true> *schemas,LogicalType *type,string *name,
          optional_ptr<const_duckdb::ChildFieldIDs,_true> field_ids,idx_t max_repeat,
          idx_t max_define,bool can_have_nulls)

{
  pointer *ppLVar1;
  idx_t max_define_00;
  pointer pSVar2;
  pointer pSVar3;
  pointer ppVar4;
  pointer pcVar5;
  void *pvVar6;
  string *psVar7;
  bool bVar8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this;
  iterator iVar9;
  child_list_t<LogicalType> *pcVar10;
  reference type_00;
  reference name_00;
  LogicalType *pLVar11;
  long lVar12;
  size_type __n;
  bool can_have_nulls_00;
  bool bVar13;
  idx_t schema_index;
  pointer name_01;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  optional_ptr<const_duckdb::FieldID,_true> field_id;
  allocator_type local_481;
  string *local_480;
  optional_ptr<const_duckdb::ChildFieldIDs,_true> local_478;
  vector<duckdb::LogicalType,_true> kv_types;
  optional_ptr<const_duckdb::ChildFieldIDs,_true> field_ids_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  kv_names;
  ParquetColumnSchema child_schema;
  LogicalType local_3a0;
  LogicalType local_388;
  LogicalType local_370;
  LogicalType local_358;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  undefined1 local_2c0 [56];
  undefined8 local_288;
  int32_t local_278;
  uint local_180;
  undefined1 local_178 [16];
  type local_168;
  char local_160 [16];
  LogicalType local_150 [3];
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> local_100 [8];
  uint local_38;
  
  pSVar2 = (schemas->
           super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
           ).
           super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar3 = (schemas->
           super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
           ).
           super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  field_id.ptr = (FieldID *)0x0;
  local_480 = name;
  field_ids_local.ptr = field_ids.ptr;
  if (field_ids.ptr == (ChildFieldIDs *)0x0) {
    local_478.ptr = (ChildFieldIDs *)0x0;
  }
  else {
    optional_ptr<const_duckdb::ChildFieldIDs,_true>::CheckValid(&field_ids_local);
    this = &unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_>,_true>
            ::operator->(&(field_ids_local.ptr)->ids)->_M_h;
    iVar9 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this,name);
    optional_ptr<const_duckdb::ChildFieldIDs,_true>::CheckValid(&field_ids_local);
    unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_>,_true>
    ::operator->(&(field_ids_local.ptr)->ids);
    if (iVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_478.ptr = (ChildFieldIDs *)0x0;
    }
    else {
      field_id.ptr = (FieldID *)
                     ((long)iVar9.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_true>
                            ._M_cur + 0x28);
      optional_ptr<const_duckdb::FieldID,_true>::CheckValid(&field_id);
      local_478.ptr = &(field_id.ptr)->child_field_ids;
    }
  }
  max_define_00 = max_define - !can_have_nulls;
  schema_index = ((long)pSVar2 - (long)pSVar3 >> 3) * -0x7063e7063e7063e7;
  local_2c0._16_4_ = ZEXT14(can_have_nulls);
  switch(type->id_) {
  case STRUCT:
  case UNION:
    pcVar10 = StructType::GetChildTypes_abi_cxx11_(type);
    duckdb_parquet::SchemaElement::SchemaElement((SchemaElement *)local_2c0);
    psVar7 = local_480;
    local_288._0_4_ =
         (int)((ulong)((long)(pcVar10->
                             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                             ).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pcVar10->
                            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
    local_180 = local_180 & 0xfffffff2 | 0xc;
    ::std::__cxx11::string::_M_assign((string *)(local_2c0 + 0x18));
    if ((field_id.ptr != (FieldID *)0x0) &&
       (optional_ptr<const_duckdb::FieldID,_true>::CheckValid(&field_id),
       (field_id.ptr)->set == true)) {
      local_180 = local_180 | 0x80;
      optional_ptr<const_duckdb::FieldID,_true>::CheckValid(&field_id);
      local_278 = (field_id.ptr)->field_id;
    }
    ::std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
    emplace_back<duckdb_parquet::SchemaElement>
              (&schemas->
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
               ,(SchemaElement *)local_2c0);
    pcVar5 = (psVar7->_M_dataplus)._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar5,pcVar5 + psVar7->_M_string_length);
    LogicalType::LogicalType(&local_358,type);
    ParquetColumnSchema::ParquetColumnSchema
              (__return_storage_ptr__,&local_2e0,&local_358,max_define_00,max_repeat,schema_index,0,
               COLUMN);
    LogicalType::~LogicalType(&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    reserve(&(__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            ,((long)(pcVar10->
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pcVar10->
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
    name_01 = (pcVar10->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (pcVar10->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (name_01 != ppVar4) {
      do {
        FillParquetSchema((ParquetColumnSchema *)local_178,schemas,&name_01->second,&name_01->first,
                          local_478,max_repeat,max_define_00 + 1,true);
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        emplace_back<duckdb::ParquetColumnSchema>
                  (&(__return_storage_ptr__->children).
                    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                   ,(ParquetColumnSchema *)local_178);
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector(local_100);
        LogicalType::~LogicalType(local_150);
        if ((char *)local_178._8_8_ != local_160) {
          operator_delete((void *)local_178._8_8_);
        }
        name_01 = name_01 + 1;
      } while (name_01 != ppVar4);
    }
    goto LAB_01ccc6a0;
  case LIST:
    pLVar11 = ListType::GetChildType(type);
    break;
  case MAP:
    duckdb_parquet::SchemaElement::SchemaElement((SchemaElement *)local_2c0);
    psVar7 = local_480;
    local_288._0_4_ = 1;
    local_288._4_4_ = MAP;
    local_180 = local_180 & 0xffffffe2 | 0x1c;
    ::std::__cxx11::string::_M_assign((string *)(local_2c0 + 0x18));
    if ((field_id.ptr != (FieldID *)0x0) &&
       (optional_ptr<const_duckdb::FieldID,_true>::CheckValid(&field_id),
       (field_id.ptr)->set == true)) {
      local_180 = local_180 | 0x80;
      optional_ptr<const_duckdb::FieldID,_true>::CheckValid(&field_id);
      local_278 = (field_id.ptr)->field_id;
    }
    ::std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
    emplace_back<duckdb_parquet::SchemaElement>
              (&schemas->
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
               ,(SchemaElement *)local_2c0);
    duckdb_parquet::SchemaElement::SchemaElement((SchemaElement *)local_178);
    local_168 = REPEATED;
    local_150[0].type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         2;
    local_38 = local_38 & 0xfffffff2 | 0xc;
    ::std::__cxx11::string::_M_replace((ulong)local_160,0,(char *)local_160._8_8_,0x1ef0a71);
    ::std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
    emplace_back<duckdb_parquet::SchemaElement>
              (&schemas->
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
               ,(SchemaElement *)local_178);
    pLVar11 = MapType::KeyType(type);
    LogicalType::LogicalType((LogicalType *)&child_schema,pLVar11);
    pLVar11 = MapType::ValueType(type);
    LogicalType::LogicalType((LogicalType *)&child_schema.name.field_2,pLVar11);
    __l._M_len = 2;
    __l._M_array = (iterator)&child_schema;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&kv_types,__l,
               (allocator_type *)&kv_names);
    lVar12 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)((long)&child_schema.schema_type + lVar12));
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != -0x18);
    child_schema._0_8_ = &child_schema.name._M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&child_schema,"key","");
    child_schema.name.field_2._8_8_ = &child_schema.type.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&child_schema.name.field_2 + 8),"value","");
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&child_schema;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&kv_names,__l_00,&local_481);
    lVar12 = 0;
    do {
      pvVar6 = *(void **)((long)&child_schema.name.field_2 + lVar12 + 8);
      if ((void *)((long)&child_schema.type.type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + lVar12) != pvVar6) {
        operator_delete(pvVar6);
      }
      lVar12 = lVar12 + -0x20;
    } while (lVar12 != -0x40);
    pcVar5 = (psVar7->_M_dataplus)._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar5,pcVar5 + psVar7->_M_string_length);
    LogicalType::LogicalType(&local_388,type);
    ParquetColumnSchema::ParquetColumnSchema
              (__return_storage_ptr__,&local_320,&local_388,max_define_00,max_repeat,schema_index,0,
               COLUMN);
    LogicalType::~LogicalType(&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    reserve(&(__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            ,2);
    can_have_nulls_00 = false;
    __n = 0;
    bVar8 = true;
    do {
      bVar13 = bVar8;
      type_00 = vector<duckdb::LogicalType,_true>::operator[](&kv_types,__n);
      name_00 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](&kv_names,__n);
      FillParquetSchema(&child_schema,schemas,type_00,name_00,local_478,max_repeat + 1,
                        max_define_00 + 2,can_have_nulls_00);
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      emplace_back<duckdb::ParquetColumnSchema>
                (&(__return_storage_ptr__->children).
                  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                 ,&child_schema);
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      ~vector(&child_schema.children.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             );
      LogicalType::~LogicalType(&child_schema.type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)child_schema.name._M_dataplus._M_p != &child_schema.name.field_2) {
        operator_delete(child_schema.name._M_dataplus._M_p);
      }
      __n = 1;
      can_have_nulls_00 = true;
      bVar8 = false;
    } while (bVar13);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&kv_names);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&kv_types);
    duckdb_parquet::SchemaElement::~SchemaElement((SchemaElement *)local_178);
LAB_01ccc6a0:
    duckdb_parquet::SchemaElement::~SchemaElement((SchemaElement *)local_2c0);
    return __return_storage_ptr__;
  default:
    duckdb_parquet::SchemaElement::SchemaElement((SchemaElement *)local_2c0);
    local_2c0._8_4_ = ParquetWriter::DuckDBTypeToParquetType(type);
    psVar7 = local_480;
    local_180 = local_180 & 0xfffffff2 | 5;
    ::std::__cxx11::string::_M_assign((string *)(local_2c0 + 0x18));
    if ((field_id.ptr != (FieldID *)0x0) &&
       (optional_ptr<const_duckdb::FieldID,_true>::CheckValid(&field_id),
       (field_id.ptr)->set == true)) {
      local_180 = local_180 | 0x80;
      optional_ptr<const_duckdb::FieldID,_true>::CheckValid(&field_id);
      local_278 = (field_id.ptr)->field_id;
    }
    ParquetWriter::SetSchemaProperties(type,(SchemaElement *)local_2c0);
    ::std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
    emplace_back<duckdb_parquet::SchemaElement>
              (&schemas->
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
               ,(SchemaElement *)local_2c0);
    pcVar5 = (psVar7->_M_dataplus)._M_p;
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340,pcVar5,pcVar5 + psVar7->_M_string_length);
    LogicalType::LogicalType(&local_3a0,type);
    ParquetColumnSchema::ParquetColumnSchema
              (__return_storage_ptr__,&local_340,&local_3a0,max_define_00,max_repeat,schema_index,0,
               COLUMN);
    LogicalType::~LogicalType(&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    goto LAB_01ccc901;
  case ARRAY:
    pLVar11 = ArrayType::GetChildType(type);
  }
  psVar7 = local_480;
  duckdb_parquet::SchemaElement::SchemaElement((SchemaElement *)local_2c0);
  local_288._0_4_ = 1;
  local_288._4_4_ = LIST;
  local_180 = local_180 & 0xffffffe2 | 0x1c;
  ::std::__cxx11::string::_M_assign((string *)(local_2c0 + 0x18));
  if ((field_id.ptr != (FieldID *)0x0) &&
     (optional_ptr<const_duckdb::FieldID,_true>::CheckValid(&field_id), (field_id.ptr)->set == true)
     ) {
    local_180 = local_180 | 0x80;
    optional_ptr<const_duckdb::FieldID,_true>::CheckValid(&field_id);
    local_278 = (field_id.ptr)->field_id;
  }
  ::std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
  emplace_back<duckdb_parquet::SchemaElement>
            (&schemas->
              super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
             ,(SchemaElement *)local_2c0);
  duckdb_parquet::SchemaElement::SchemaElement((SchemaElement *)local_178);
  local_168 = REPEATED;
  local_150[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  local_38 = local_38 & 0xfffffff2 | 0xc;
  ::std::__cxx11::string::_M_replace((ulong)local_160,0,(char *)local_160._8_8_,0x1d99e31);
  ::std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
  emplace_back<duckdb_parquet::SchemaElement>
            (&schemas->
              super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
             ,(SchemaElement *)local_178);
  pcVar5 = (psVar7->_M_dataplus)._M_p;
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,pcVar5,pcVar5 + psVar7->_M_string_length);
  LogicalType::LogicalType(&local_370,type);
  ParquetColumnSchema::ParquetColumnSchema
            (__return_storage_ptr__,&local_300,&local_370,max_define_00,max_repeat,schema_index,0,
             COLUMN);
  LogicalType::~LogicalType(&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  ppLVar1 = &kv_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  kv_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppLVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&kv_types,"element","");
  FillParquetSchema(&child_schema,schemas,pLVar11,(string *)&kv_types,local_478,max_repeat + 1,
                    max_define_00 + 2,true);
  ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
  emplace_back<duckdb::ParquetColumnSchema>
            (&(__return_storage_ptr__->children).
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ,&child_schema);
  ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::~vector
            (&child_schema.children.
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            );
  LogicalType::~LogicalType(&child_schema.type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)child_schema.name._M_dataplus._M_p != &child_schema.name.field_2) {
    operator_delete(child_schema.name._M_dataplus._M_p);
  }
  if (kv_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppLVar1) {
    operator_delete(kv_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  duckdb_parquet::SchemaElement::~SchemaElement((SchemaElement *)local_178);
LAB_01ccc901:
  duckdb_parquet::SchemaElement::~SchemaElement((SchemaElement *)local_2c0);
  return __return_storage_ptr__;
}

Assistant:

ParquetColumnSchema ColumnWriter::FillParquetSchema(vector<duckdb_parquet::SchemaElement> &schemas,
                                                    const LogicalType &type, const string &name,
                                                    optional_ptr<const ChildFieldIDs> field_ids, idx_t max_repeat,
                                                    idx_t max_define, bool can_have_nulls) {
	auto null_type = can_have_nulls ? FieldRepetitionType::OPTIONAL : FieldRepetitionType::REQUIRED;
	if (!can_have_nulls) {
		max_define--;
	}
	idx_t schema_idx = schemas.size();

	optional_ptr<const FieldID> field_id;
	optional_ptr<const ChildFieldIDs> child_field_ids;
	if (field_ids) {
		auto field_id_it = field_ids->ids->find(name);
		if (field_id_it != field_ids->ids->end()) {
			field_id = &field_id_it->second;
			child_field_ids = &field_id->child_field_ids;
		}
	}

	if (type.id() == LogicalTypeId::STRUCT || type.id() == LogicalTypeId::UNION) {
		auto &child_types = StructType::GetChildTypes(type);
		// set up the schema element for this struct
		duckdb_parquet::SchemaElement schema_element;
		schema_element.repetition_type = null_type;
		schema_element.num_children = UnsafeNumericCast<int32_t>(child_types.size());
		schema_element.__isset.num_children = true;
		schema_element.__isset.type = false;
		schema_element.__isset.repetition_type = true;
		schema_element.name = name;
		if (field_id && field_id->set) {
			schema_element.__isset.field_id = true;
			schema_element.field_id = field_id->field_id;
		}
		schemas.push_back(std::move(schema_element));

		ParquetColumnSchema struct_column(name, type, max_define, max_repeat, schema_idx, 0);
		// construct the child schemas recursively
		struct_column.children.reserve(child_types.size());
		for (auto &child_type : child_types) {
			struct_column.children.emplace_back(FillParquetSchema(schemas, child_type.second, child_type.first,
			                                                      child_field_ids, max_repeat, max_define + 1));
		}
		return struct_column;
	}
	if (type.id() == LogicalTypeId::LIST || type.id() == LogicalTypeId::ARRAY) {
		auto is_list = type.id() == LogicalTypeId::LIST;
		auto &child_type = is_list ? ListType::GetChildType(type) : ArrayType::GetChildType(type);
		// set up the two schema elements for the list
		// for some reason we only set the converted type in the OPTIONAL element
		// first an OPTIONAL element
		duckdb_parquet::SchemaElement optional_element;
		optional_element.repetition_type = null_type;
		optional_element.num_children = 1;
		optional_element.converted_type = ConvertedType::LIST;
		optional_element.__isset.num_children = true;
		optional_element.__isset.type = false;
		optional_element.__isset.repetition_type = true;
		optional_element.__isset.converted_type = true;
		optional_element.name = name;
		if (field_id && field_id->set) {
			optional_element.__isset.field_id = true;
			optional_element.field_id = field_id->field_id;
		}
		schemas.push_back(std::move(optional_element));

		// then a REPEATED element
		duckdb_parquet::SchemaElement repeated_element;
		repeated_element.repetition_type = FieldRepetitionType::REPEATED;
		repeated_element.num_children = 1;
		repeated_element.__isset.num_children = true;
		repeated_element.__isset.type = false;
		repeated_element.__isset.repetition_type = true;
		repeated_element.name = "list";
		schemas.push_back(std::move(repeated_element));

		ParquetColumnSchema list_column(name, type, max_define, max_repeat, schema_idx, 0);
		list_column.children.push_back(
		    FillParquetSchema(schemas, child_type, "element", child_field_ids, max_repeat + 1, max_define + 2));
		return list_column;
	}
	if (type.id() == LogicalTypeId::MAP) {
		// map type
		// maps are stored as follows:
		// <map-repetition> group <name> (MAP) {
		// 	repeated group key_value {
		// 		required <key-type> key;
		// 		<value-repetition> <value-type> value;
		// 	}
		// }
		// top map element
		duckdb_parquet::SchemaElement top_element;
		top_element.repetition_type = null_type;
		top_element.num_children = 1;
		top_element.converted_type = ConvertedType::MAP;
		top_element.__isset.repetition_type = true;
		top_element.__isset.num_children = true;
		top_element.__isset.converted_type = true;
		top_element.__isset.type = false;
		top_element.name = name;
		if (field_id && field_id->set) {
			top_element.__isset.field_id = true;
			top_element.field_id = field_id->field_id;
		}
		schemas.push_back(std::move(top_element));

		// key_value element
		duckdb_parquet::SchemaElement kv_element;
		kv_element.repetition_type = FieldRepetitionType::REPEATED;
		kv_element.num_children = 2;
		kv_element.__isset.repetition_type = true;
		kv_element.__isset.num_children = true;
		kv_element.__isset.type = false;
		kv_element.name = "key_value";
		schemas.push_back(std::move(kv_element));

		// construct the child types recursively
		vector<LogicalType> kv_types {MapType::KeyType(type), MapType::ValueType(type)};
		vector<string> kv_names {"key", "value"};

		ParquetColumnSchema map_column(name, type, max_define, max_repeat, schema_idx, 0);
		map_column.children.reserve(2);
		for (idx_t i = 0; i < 2; i++) {
			// key needs to be marked as REQUIRED
			bool is_key = i == 0;
			auto child_schema = FillParquetSchema(schemas, kv_types[i], kv_names[i], child_field_ids, max_repeat + 1,
			                                      max_define + 2, !is_key);

			map_column.children.push_back(std::move(child_schema));
		}
		return map_column;
	}
	duckdb_parquet::SchemaElement schema_element;
	schema_element.type = ParquetWriter::DuckDBTypeToParquetType(type);
	schema_element.repetition_type = null_type;
	schema_element.__isset.num_children = false;
	schema_element.__isset.type = true;
	schema_element.__isset.repetition_type = true;
	schema_element.name = name;
	if (field_id && field_id->set) {
		schema_element.__isset.field_id = true;
		schema_element.field_id = field_id->field_id;
	}
	ParquetWriter::SetSchemaProperties(type, schema_element);
	schemas.push_back(std::move(schema_element));
	return ParquetColumnSchema(name, type, max_define, max_repeat, schema_idx, 0);
}